

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O0

void __thiscall mocker::ast::Identifier::~Identifier(Identifier *this)

{
  Identifier *this_local;
  
  (this->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__Identifier_0039c6f0;
  std::__cxx11::string::~string((string *)&this->val);
  ASTNode::~ASTNode(&this->super_ASTNode);
  return;
}

Assistant:

explicit Identifier(std::string val) : val(std::move(val)) {}